

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O3

_Bool ptrlen_contains_only(ptrlen input,char *characters)

{
  bool bVar1;
  char *pcVar2;
  char *p;
  char *pcVar3;
  
  if ((long)input.len < 1) {
    return true;
  }
  pcVar2 = (char *)input.ptr;
  do {
    pcVar3 = pcVar2 + 1;
    pcVar2 = strchr(characters,(int)*pcVar2);
    bVar1 = pcVar2 != (char *)0x0;
    if (pcVar2 == (char *)0x0) {
      return bVar1;
    }
    pcVar2 = pcVar3;
  } while (pcVar3 < (char *)((long)input.ptr + input.len));
  return bVar1;
}

Assistant:

bool ptrlen_contains_only(ptrlen input, const char *characters)
{
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++)
        if (!strchr(characters, *p))
            return false;
    return true;
}